

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O1

void __thiscall amrex::FabArrayBase::FB::define_epo(FB *this,FabArrayBase *fa)

{
  BoxArray *this_00;
  pointer *ppCVar1;
  undefined8 uVar2;
  undefined1 auVar3 [12];
  undefined4 uVar4;
  pointer piVar5;
  pointer piVar6;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *this_01;
  iterator iVar7;
  vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_> *this_02
  ;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  long lVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  void *pvVar19;
  undefined4 uVar20;
  pointer pBVar21;
  uint uVar22;
  uint uVar23;
  mapped_type *pmVar24;
  _Rb_tree_node_base *p_Var25;
  int dir;
  uint uVar26;
  int iVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  pointer pBVar31;
  ulong uVar32;
  FB *pFVar33;
  IndexType IVar34;
  pointer pBVar35;
  pointer pIVar36;
  bool bVar37;
  int iVar38;
  int iVar44;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar45 [12];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int iVar50;
  int iVar54;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  int iVar55;
  undefined1 auVar53 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  int src_owner;
  Box r;
  BoxList bl_local;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  Box r_3;
  Box r_2;
  BoxList bl_remote;
  BoxList tilelist;
  uint local_290;
  Box local_268;
  ulong local_248;
  int local_23c;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  BoxArray local_228;
  ulong local_1b8;
  ulong local_1b0;
  BoxList local_1a8;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_188;
  Box local_170;
  ulong local_150;
  long local_148;
  FB *local_140;
  uint local_138;
  int local_134;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_130;
  ulong local_118;
  IntVect *local_110;
  Box local_104;
  Box local_e8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  BoxList local_a8;
  undefined1 local_88 [16];
  BoxList local_70;
  BoxList local_50;
  undefined1 auVar58 [12];
  
  piVar5 = (fa->indexArray).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  uVar23 = 0;
  switch((fa->boxarray).m_bat.m_bat_type) {
  case null:
  case coarsenRatio:
    break;
  case indexType:
  case indexType_coarsenRatio:
    uVar23 = *(uint *)&(fa->boxarray).m_bat.m_op;
    break;
  default:
    uVar23 = *(uint *)((long)&(fa->boxarray).m_bat.m_op + 4);
  }
  piVar6 = (fa->indexArray).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  local_230 = *(int *)(ParallelContext::frames + 0xc);
  local_188.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Periodicity::shiftIntVect(&local_130,&this->m_period);
  this_00 = &fa->boxarray;
  local_110 = &this->m_ngrow;
  this_01 = (this->super_CommMetaData).m_SndTags._M_t.
            super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
            .
            super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
            ._M_head_impl;
  Periodicity::Domain(&this->m_period);
  lVar28 = 0;
  do {
    uVar22 = 1 << ((byte)lVar28 & 0x1f);
    uVar26 = (uint)lVar28;
    local_268.bigend.vect[lVar28] =
         (local_268.bigend.vect[lVar28] + (uint)((uVar23 >> (uVar26 & 0x1f) & 1) != 0)) -
         (uint)((local_268.btype.itype >> (uVar26 & 0x1f) & 1) != 0);
    if ((uVar23 >> (uVar26 & 0x1f) & 1) == 0) {
      local_268.btype.itype = ~uVar22 & local_268.btype.itype;
    }
    else {
      local_268.btype.itype = uVar22 | local_268.btype.itype;
    }
    lVar28 = lVar28 + 1;
  } while (lVar28 != 3);
  local_290 = (uint)((ulong)((long)piVar5 - (long)piVar6) >> 2);
  local_140 = this;
  if (0 < (int)local_290) {
    local_1b8 = (ulong)(local_290 & 0x7fffffff);
    uVar32 = 0;
    do {
      pFVar33 = local_140;
      iVar30 = (fa->indexArray).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar32];
      local_b8._0_8_ = (long)iVar30;
      local_1b0 = uVar32;
      BATransformer::operator()
                ((Box *)&local_228,&this_00->m_bat,
                 (Box *)((long)iVar30 * 0x1c +
                        *(long *)&(((fa->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      uVar20 = local_228.m_bat.m_op.m_bndryReg.m_loshft.vect[0];
      iVar29 = (pFVar33->m_ngrow).vect[2];
      iVar27 = (int)local_228.m_bat.m_op.m_bndryReg.m_typ.itype - iVar29;
      iVar29 = iVar29 + local_228.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2];
      uVar2 = *(undefined8 *)(pFVar33->m_ngrow).vect;
      iVar50 = (int)uVar2;
      iVar38 = local_228.m_bat.m_bat_type - iVar50;
      iVar54 = (int)((ulong)uVar2 >> 0x20);
      iVar44 = (int)local_228.m_bat.m_op.m_indexType.m_typ.itype - iVar54;
      iVar50 = local_228.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] + iVar50;
      iVar54 = local_228.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] + iVar54;
      auVar46._4_4_ = local_268.smallend.vect[1];
      auVar46._0_4_ = local_268.smallend.vect[0];
      auVar46._8_8_ = 0;
      auVar56._0_8_ =
           CONCAT44(-(uint)(local_268.smallend.vect[1] < iVar44),
                    -(uint)(local_268.smallend.vect[0] < iVar38));
      auVar56._8_8_ = 0;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = CONCAT44(iVar44,iVar38) & auVar56._0_8_;
      local_88 = ~auVar56 & auVar46 | auVar39;
      if (iVar27 <= local_268.smallend.vect[2]) {
        iVar27 = local_268.smallend.vect[2];
      }
      auVar40._4_4_ = local_268.bigend.vect[1];
      auVar40._0_4_ = local_268.bigend.vect[0];
      auVar40._8_8_ = 0;
      auVar47._0_8_ =
           CONCAT44(-(uint)(iVar54 < local_268.bigend.vect[1]),
                    -(uint)(iVar50 < local_268.bigend.vect[0]));
      auVar47._8_8_ = 0;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = CONCAT44(iVar54,iVar50) & auVar47._0_8_;
      local_c8 = ~auVar47 & auVar40 | auVar51;
      if (local_268.bigend.vect[2] <= iVar29) {
        iVar29 = local_268.bigend.vect[2];
      }
      auVar41._0_4_ = -(uint)(local_c8._0_4_ < local_88._0_4_);
      iVar38 = -(uint)(local_c8._4_4_ < local_88._4_4_);
      auVar41._4_4_ = auVar41._0_4_;
      auVar41._8_4_ = iVar38;
      auVar41._12_4_ = iVar38;
      iVar38 = movmskpd(local_268.bigend.vect[2],auVar41);
      local_148 = CONCAT44(local_148._4_4_,iVar29);
      if ((((uint)local_228.m_bat.m_op.m_bndryReg.m_loshft.vect[0] < 8 && iVar27 <= iVar29) &&
           iVar38 == 0) &&
         (local_130.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_130.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        local_150 = CONCAT44(local_150._4_4_,local_c8._0_4_);
        local_248 = CONCAT44(local_248._4_4_,local_c8._4_4_);
        pIVar36 = local_130.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          if (((pIVar36->vect[0] != 0) || (pIVar36->vect[1] != 0)) || (pIVar36->vect[2] != 0)) {
            local_228.m_bat.m_bat_type = (int)*(undefined8 *)pIVar36->vect + local_88._0_4_;
            local_228.m_bat.m_op.m_indexType.m_typ.itype =
                 (BATindexType)((int)((ulong)*(undefined8 *)pIVar36->vect >> 0x20) + local_88._4_4_)
            ;
            local_228.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)(pIVar36->vect[2] + iVar27);
            local_228.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = pIVar36->vect[0] + (int)local_150
            ;
            local_228.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] = pIVar36->vect[1] + (int)local_248
            ;
            local_228.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2] = pIVar36->vect[2] + (int)local_148
            ;
            local_228.m_bat.m_op.m_bndryReg.m_loshft.vect[0] = uVar20;
            BoxArray::intersections(this_00,(Box *)&local_228,&local_188,false,local_110);
            uVar23 = (uint)((ulong)((long)local_188.
                                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_188.
                                         super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5);
            if (0 < (int)uVar23) {
              uVar32 = 0;
              do {
                iVar29 = local_188.
                         super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar32].first;
                lVar28 = *(long *)&(((fa->distributionMap).m_ref.
                                     super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl;
                local_a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ = *(int *)(lVar28 + (long)iVar29 * 4);
                if ((int)local_a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                         super__Vector_impl_data._M_start < 0) {
                  iVar38 = 0;
                }
                else {
                  iVar38 = (int)local_a8.m_lbox.
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_start -
                           (int)local_a8.m_lbox.
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_start %
                           (int)ParallelDescriptor::m_Team._4_4_;
                }
                if ((ParallelDescriptor::m_Team._12_4_ != iVar38) &&
                   (local_230 == *(int *)(lVar28 + local_b8._0_8_ * 4))) {
                  boxDiff(&local_1a8,
                          &local_188.
                           super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar32].second,&local_268);
                  for (pBVar35 = local_1a8.m_lbox.
                                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                                 .super__Vector_impl_data._M_start;
                      pBVar35 !=
                      local_1a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_finish; pBVar35 = pBVar35 + 1) {
                    pmVar24 = std::
                              map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                              ::operator[](this_01,(key_type *)&local_a8);
                    local_228.m_bat.m_op.m_bndryReg.m_doilo.vect[1] = (pBVar35->btype).itype;
                    uVar2 = *(undefined8 *)((pBVar35->bigend).vect + 1);
                    iVar38 = (int)*(undefined8 *)(pIVar36->vect + 1);
                    local_228.m_bat.m_op.m_bndryReg.m_hishft.vect[2] = (int)uVar2 - iVar38;
                    iVar44 = (int)((ulong)*(undefined8 *)(pIVar36->vect + 1) >> 0x20);
                    local_228.m_bat.m_op.m_bndryReg.m_doilo.vect[0] =
                         (int)((ulong)uVar2 >> 0x20) - iVar44;
                    local_228.m_bat.m_op.m_bndryReg.m_loshft.vect[1] =
                         (pBVar35->smallend).vect[0] - pIVar36->vect[0];
                    local_228.m_bat.m_op.m_bndryReg.m_loshft.vect[2] =
                         (pBVar35->smallend).vect[1] - iVar38;
                    local_228.m_bat.m_op.m_bndryReg.m_hishft.vect[0] =
                         (pBVar35->smallend).vect[2] - iVar44;
                    local_228.m_bat.m_op.m_bndryReg.m_hishft.vect[1] =
                         (pBVar35->bigend).vect[0] - pIVar36->vect[0];
                    auVar3 = *(undefined1 (*) [12])&pBVar35->smallend;
                    uVar4 = (pBVar35->bigend).vect[0];
                    uVar2 = *(undefined8 *)((pBVar35->bigend).vect + 2);
                    local_228.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] =
                         (int)((ulong)*(undefined8 *)(pBVar35->bigend).vect >> 0x20);
                    local_228.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2] = (int)uVar2;
                    local_228.m_bat.m_op.m_bndryReg.m_loshft.vect[0] = (int)((ulong)uVar2 >> 0x20);
                    local_228.m_bat.m_bat_type = auVar3._0_4_;
                    local_228.m_bat.m_op.m_indexType.m_typ.itype = auVar3._4_4_;
                    local_228.m_bat.m_op.m_bndryReg.m_typ.itype = auVar3._8_4_;
                    iVar7._M_current =
                         (pmVar24->
                         super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
                    local_228.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = uVar4;
                    local_228.m_bat.m_op.m_bndryReg.m_doilo.vect[2] = iVar29;
                    local_228.m_bat.m_op.m_bndryReg.m_doihi.vect[0] = iVar30;
                    if (iVar7._M_current ==
                        (pmVar24->
                        super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::
                      vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                      ::_M_realloc_insert<amrex::FabArrayBase::CopyComTag>
                                (pmVar24,iVar7,(CopyComTag *)&local_228);
                    }
                    else {
                      auVar13._4_4_ = local_228.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2];
                      auVar13._0_4_ = local_228.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
                      auVar13._8_4_ = local_228.m_bat.m_op.m_bndryReg.m_loshft.vect[0];
                      auVar13._12_4_ = local_228.m_bat.m_op.m_bndryReg.m_loshft.vect[1];
                      *(ulong *)(((iVar7._M_current)->sbox).bigend.vect + 2) =
                           CONCAT44(local_228.m_bat.m_op.m_bndryReg.m_doilo.vect[1],
                                    local_228.m_bat.m_op.m_bndryReg.m_doilo.vect[0]);
                      (iVar7._M_current)->dstIndex = iVar29;
                      (iVar7._M_current)->srcIndex = iVar30;
                      *(ulong *)(((iVar7._M_current)->sbox).smallend.vect + 1) =
                           CONCAT44(local_228.m_bat.m_op.m_bndryReg.m_hishft.vect[0],
                                    local_228.m_bat.m_op.m_bndryReg.m_loshft.vect[2]);
                      *(ulong *)((iVar7._M_current)->sbox).bigend.vect =
                           CONCAT44(local_228.m_bat.m_op.m_bndryReg.m_hishft.vect[2],
                                    local_228.m_bat.m_op.m_bndryReg.m_hishft.vect[1]);
                      *(undefined1 (*) [16])(((iVar7._M_current)->dbox).bigend.vect + 1) = auVar13;
                      ((iVar7._M_current)->dbox).smallend.vect[0] = local_228.m_bat.m_bat_type;
                      ((iVar7._M_current)->dbox).smallend.vect[1] =
                           (int)local_228.m_bat.m_op.m_indexType.m_typ.itype;
                      ((iVar7._M_current)->dbox).smallend.vect[2] =
                           (int)local_228.m_bat.m_op.m_bndryReg.m_typ.itype;
                      ((iVar7._M_current)->dbox).bigend.vect[0] = uVar4;
                      ppCVar1 = &(pmVar24->
                                 super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                                 )._M_impl.super__Vector_impl_data._M_finish;
                      *ppCVar1 = *ppCVar1 + 1;
                    }
                  }
                  if (local_1a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start != (Box *)0x0) {
                    operator_delete(local_1a8.m_lbox.
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_1a8.m_lbox.
                                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_1a8.m_lbox.
                                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                uVar32 = uVar32 + 1;
              } while (uVar32 != (uVar23 & 0x7fffffff));
            }
          }
          pIVar36 = pIVar36 + 1;
        } while (pIVar36 !=
                 local_130.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      uVar32 = local_1b0 + 1;
    } while (uVar32 != local_1b8);
  }
  pFVar33 = local_140;
  IVar34.itype = 0;
  switch((this_00->m_bat).m_bat_type) {
  case null:
  case coarsenRatio:
    break;
  case indexType:
  case indexType_coarsenRatio:
    IVar34.itype = (fa->boxarray).m_bat.m_op.m_indexType.m_typ.itype;
    break;
  default:
    IVar34.itype = (fa->boxarray).m_bat.m_op.m_bndryReg.m_typ.itype;
  }
  local_88._0_8_ =
       (local_140->super_CommMetaData).m_RcvTags._M_t.
       super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
       .
       super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
       ._M_head_impl;
  BoxList::BoxList(&local_1a8,IVar34);
  IVar34.itype = 0;
  switch((this_00->m_bat).m_bat_type) {
  case null:
  case coarsenRatio:
    break;
  case indexType:
  case indexType_coarsenRatio:
    IVar34.itype = (fa->boxarray).m_bat.m_op.m_indexType.m_typ.itype;
    break;
  default:
    IVar34.itype = (fa->boxarray).m_bat.m_op.m_bndryReg.m_typ.itype;
  }
  BoxList::BoxList(&local_a8,IVar34);
  uVar20 = ParallelDescriptor::m_Team._4_4_;
  if (0 < (int)local_290) {
    uVar32 = 0;
    do {
      iVar30 = (fa->indexArray).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar32];
      local_148 = (long)iVar30;
      BATransformer::operator()
                (&local_104,&this_00->m_bat,
                 (Box *)(local_148 * 0x1c +
                        *(long *)&(((fa->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      local_138 = local_104.btype.itype;
      local_234 = (pFVar33->m_ngrow).vect[0];
      local_238 = (pFVar33->m_ngrow).vect[1];
      local_134 = local_104.smallend.vect[0] - local_234;
      iVar29 = local_104.smallend.vect[1] - local_238;
      local_1b0 = CONCAT44(local_1b0._4_4_,iVar29);
      local_23c = (pFVar33->m_ngrow).vect[2];
      iVar27 = local_104.smallend.vect[2] - local_23c;
      local_1b8 = CONCAT44(local_1b8._4_4_,iVar27);
      local_234 = local_234 + local_104.bigend.vect[0];
      local_238 = local_238 + local_104.bigend.vect[1];
      local_23c = local_23c + local_104.bigend.vect[2];
      pIVar36 = local_130.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (((local_134 < local_268.smallend.vect[0]) || (iVar29 < local_268.smallend.vect[1])) ||
         ((iVar27 < local_268.smallend.vect[2] ||
          (((local_268.bigend.vect[0] < local_234 || (local_268.bigend.vect[1] < local_238)) ||
           (local_268.bigend.vect[2] < local_23c)))))) {
        for (; local_118 = uVar32,
            pIVar36 !=
            local_130.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
            super__Vector_impl_data._M_finish; pIVar36 = pIVar36 + 1) {
          if (((pIVar36->vect[0] != 0) || (pIVar36->vect[1] != 0)) || (pIVar36->vect[2] != 0)) {
            local_228.m_bat.m_op.m_bndryReg.m_loshft.vect[0] = local_138;
            local_228.m_bat.m_bat_type = pIVar36->vect[0] + local_134;
            local_228.m_bat.m_op.m_indexType.m_typ.itype =
                 (BATindexType)(pIVar36->vect[1] + (int)local_1b0);
            local_228.m_bat.m_op.m_bndryReg.m_typ.itype =
                 (IndexType)(pIVar36->vect[2] + (int)local_1b8);
            local_228.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = pIVar36->vect[0] + local_234;
            local_228.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] = pIVar36->vect[1] + local_238;
            local_228.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2] = pIVar36->vect[2] + local_23c;
            BoxArray::intersections(this_00,(Box *)&local_228,&local_188,false,local_110);
            local_248 = (ulong)((long)local_188.
                                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_188.
                                     super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5;
            if (0 < (int)(uint)local_248) {
              local_248 = (ulong)((uint)local_248 & 0x7fffffff);
              uVar32 = 0;
              do {
                iVar29 = local_188.
                         super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar32].first;
                uVar2 = *(undefined8 *)
                         local_188.
                         super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar32].second.smallend.vect;
                uVar11 = *(undefined8 *)
                          (local_188.
                           super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar32].second.smallend.vect +
                          2);
                uVar12 = *(undefined8 *)
                          (local_188.
                           super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar32].second.bigend.vect + 2)
                ;
                local_e8.bigend.vect[1] =
                     (int)((ulong)*(undefined8 *)
                                   local_188.
                                   super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar32].second.bigend.
                                   vect >> 0x20);
                local_e8.smallend.vect[2] = (int)uVar11;
                local_e8.bigend.vect[0] = (int)((ulong)uVar11 >> 0x20);
                local_e8.smallend.vect[0] = (int)uVar2 - (int)*(undefined8 *)pIVar36->vect;
                local_e8.smallend.vect[1] =
                     (int)((ulong)uVar2 >> 0x20) -
                     (int)((ulong)*(undefined8 *)pIVar36->vect >> 0x20);
                local_e8.smallend.vect[2] = local_e8.smallend.vect[2] - pIVar36->vect[2];
                local_e8.bigend.vect[0] = local_e8.bigend.vect[0] - pIVar36->vect[0];
                local_e8.bigend.vect[1] = local_e8.bigend.vect[1] - pIVar36->vect[1];
                local_e8.bigend.vect[2] = (int)uVar12;
                local_e8.btype.itype = (uint)((ulong)uVar12 >> 0x20);
                local_e8.bigend.vect[2] = local_e8.bigend.vect[2] - pIVar36->vect[2];
                local_22c = *(int *)(*(long *)&(((fa->distributionMap).m_ref.
                                                 super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr)->m_pmap).
                                               super_vector<int,_std::allocator<int>_>.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    + (long)iVar29 * 4);
                boxDiff(&local_70,&local_e8,&local_268);
                local_150 = uVar32;
                for (pBVar35 = local_70.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                               .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data._M_start;
                    pBVar35 !=
                    local_70.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish; pBVar35 = pBVar35 + 1) {
                  iVar27 = (pBVar35->smallend).vect[2] + pIVar36->vect[2];
                  iVar38 = pIVar36->vect[2] + (pBVar35->bigend).vect[2];
                  uVar2 = *(undefined8 *)(pBVar35->smallend).vect;
                  iVar54 = (int)*(undefined8 *)pIVar36->vect;
                  iVar44 = (int)uVar2 + iVar54;
                  iVar55 = (int)((ulong)*(undefined8 *)pIVar36->vect >> 0x20);
                  iVar50 = (int)((ulong)uVar2 >> 0x20) + iVar55;
                  auVar52._4_4_ = local_268.smallend.vect[1];
                  auVar52._0_4_ = local_268.smallend.vect[0];
                  auVar52._8_8_ = 0;
                  auVar57._0_8_ =
                       CONCAT44(-(uint)(local_268.smallend.vect[1] < iVar50),
                                -(uint)(local_268.smallend.vect[0] < iVar44));
                  auVar57._8_8_ = 0;
                  auVar42._8_8_ = 0;
                  auVar42._0_8_ = CONCAT44(iVar50,iVar44) & auVar57._0_8_;
                  local_b8 = ~auVar57 & auVar52 | auVar42;
                  if (iVar27 <= local_268.smallend.vect[2]) {
                    iVar27 = local_268.smallend.vect[2];
                  }
                  uVar2 = *(undefined8 *)(pBVar35->bigend).vect;
                  iVar54 = (int)uVar2 + iVar54;
                  iVar55 = (int)((ulong)uVar2 >> 0x20) + iVar55;
                  auVar48._4_4_ = local_268.bigend.vect[1];
                  auVar48._0_4_ = local_268.bigend.vect[0];
                  auVar48._8_8_ = 0;
                  auVar43._0_8_ =
                       CONCAT44(-(uint)(iVar55 < local_268.bigend.vect[1]),
                                -(uint)(iVar54 < local_268.bigend.vect[0]));
                  auVar43._8_8_ = 0;
                  auVar53._8_8_ = 0;
                  auVar53._0_8_ = CONCAT44(iVar55,iVar54) & auVar43._0_8_;
                  auVar53 = ~auVar43 & auVar48 | auVar53;
                  if (local_268.bigend.vect[2] <= iVar38) {
                    iVar38 = local_268.bigend.vect[2];
                  }
                  iVar44 = auVar53._0_4_;
                  auVar49._0_4_ = -(uint)(iVar44 < local_b8._0_4_);
                  iVar50 = auVar53._4_4_;
                  iVar54 = -(uint)(iVar50 < local_b8._4_4_);
                  auVar49._4_4_ = auVar49._0_4_;
                  auVar49._8_4_ = iVar54;
                  auVar49._12_4_ = iVar54;
                  uVar23 = movmskpd(local_268.smallend.vect[2],auVar49);
                  if (((((uVar23 ^ 3) & 1) != 0) && ((byte)((byte)(uVar23 ^ 3) >> 1) != 0)) &&
                     ((iVar27 <= iVar38 && (uVar23 = (pBVar35->btype).itype, uVar23 < 8)))) {
                    local_170.smallend.vect[0] = local_b8._0_4_ - (int)*(undefined8 *)pIVar36->vect;
                    local_170.smallend.vect[1] =
                         local_b8._4_4_ - (int)((ulong)*(undefined8 *)pIVar36->vect >> 0x20);
                    local_170.smallend.vect[2] = iVar27 - pIVar36->vect[2];
                    local_c8._0_4_ = iVar44;
                    local_170.bigend.vect[0] = iVar44 - pIVar36->vect[0];
                    local_170.bigend.vect[1] = iVar50 - pIVar36->vect[1];
                    local_170.bigend.vect[2] = iVar38 - pIVar36->vect[2];
                    if (local_22c < 0) {
                      iVar44 = 0;
                    }
                    else {
                      iVar44 = local_22c - local_22c % (int)ParallelDescriptor::m_Team._4_4_;
                    }
                    local_170.btype.itype = uVar23;
                    if (ParallelDescriptor::m_Team._12_4_ == iVar44) {
                      BoxList::BoxList(&local_50,&local_170,(IntVect *)&comm_tile_size);
                      pBVar21 = local_50.m_lbox.
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_finish;
                      pFVar33 = local_140;
                      for (pBVar31 = local_50.m_lbox.
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data._M_start; pBVar31 != pBVar21;
                          pBVar31 = pBVar31 + 1) {
                        this_02 = (pFVar33->super_CommMetaData).m_LocTags._M_t.
                                  super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                                  ._M_head_impl;
                        local_228.m_bat.m_op.m_bndryReg.m_doilo.vect[1] = (pBVar31->btype).itype;
                        uVar2 = *(undefined8 *)((pBVar31->bigend).vect + 1);
                        iVar27 = (int)*(undefined8 *)(pIVar36->vect + 1);
                        local_228.m_bat.m_op.m_bndryReg.m_hishft.vect[2] = (int)uVar2 + iVar27;
                        iVar38 = (int)((ulong)*(undefined8 *)(pIVar36->vect + 1) >> 0x20);
                        local_228.m_bat.m_op.m_bndryReg.m_doilo.vect[0] =
                             (int)((ulong)uVar2 >> 0x20) + iVar38;
                        auVar45._0_4_ = pIVar36->vect[0] + (pBVar31->smallend).vect[0];
                        auVar45._4_4_ = iVar27 + (pBVar31->smallend).vect[1];
                        auVar45._8_4_ = iVar38 + (pBVar31->smallend).vect[2];
                        local_228.m_bat.m_op.m_bndryReg.m_hishft.vect[1] =
                             pIVar36->vect[0] + (pBVar31->bigend).vect[0];
                        uVar2 = *(undefined8 *)(pBVar31->smallend).vect;
                        uVar11 = *(undefined8 *)((pBVar31->smallend).vect + 2);
                        uVar12 = *(undefined8 *)((pBVar31->bigend).vect + 2);
                        local_228.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] =
                             (int)((ulong)*(undefined8 *)(pBVar31->bigend).vect >> 0x20);
                        local_228.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2] = (int)uVar12;
                        local_228.m_bat.m_op.m_bndryReg.m_loshft.vect[0] =
                             (int)((ulong)uVar12 >> 0x20);
                        local_228.m_bat.m_bat_type = (BATType)uVar2;
                        local_228.m_bat.m_op.m_indexType.m_typ.itype = SUB84((ulong)uVar2 >> 0x20,0)
                        ;
                        local_228.m_bat.m_op.m_bndryReg.m_typ.itype = SUB84(uVar11,0);
                        local_228.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] =
                             (int)((ulong)uVar11 >> 0x20);
                        iVar7._M_current =
                             *(pointer *)
                              ((long)&(this_02->
                                      super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                                      )._M_impl + 8);
                        local_228.m_bat.m_op.m_bndryReg.m_loshft.vect[1] = auVar45._0_4_;
                        local_228.m_bat.m_op.m_bndryReg.m_loshft.vect[2] = auVar45._4_4_;
                        local_228.m_bat.m_op.m_bndryReg.m_hishft.vect[0] = auVar45._8_4_;
                        if (iVar7._M_current ==
                            *(pointer *)
                             ((long)&(this_02->
                                     super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                                     )._M_impl + 0x10)) {
                          local_228.m_bat.m_op.m_bndryReg.m_doilo.vect[2] = iVar30;
                          local_228.m_bat.m_op.m_bndryReg.m_doihi.vect[0] = iVar29;
                          std::
                          vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                          ::_M_realloc_insert<amrex::FabArrayBase::CopyComTag>
                                    (this_02,iVar7,(CopyComTag *)&local_228);
                        }
                        else {
                          auVar14._4_4_ = local_228.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2];
                          auVar14._0_4_ = local_228.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
                          auVar14._8_4_ = local_228.m_bat.m_op.m_bndryReg.m_loshft.vect[0];
                          auVar14._12_4_ = auVar45._0_4_;
                          *(ulong *)(((iVar7._M_current)->sbox).bigend.vect + 2) =
                               CONCAT44(local_228.m_bat.m_op.m_bndryReg.m_doilo.vect[1],
                                        local_228.m_bat.m_op.m_bndryReg.m_doilo.vect[0]);
                          (iVar7._M_current)->dstIndex = iVar30;
                          (iVar7._M_current)->srcIndex = iVar29;
                          *(long *)(((iVar7._M_current)->sbox).smallend.vect + 1) = auVar45._4_8_;
                          *(ulong *)((iVar7._M_current)->sbox).bigend.vect =
                               CONCAT44(local_228.m_bat.m_op.m_bndryReg.m_hishft.vect[2],
                                        local_228.m_bat.m_op.m_bndryReg.m_hishft.vect[1]);
                          *(undefined1 (*) [16])(((iVar7._M_current)->dbox).bigend.vect + 1) =
                               auVar14;
                          *(undefined8 *)((iVar7._M_current)->dbox).smallend.vect = uVar2;
                          *(undefined8 *)(((iVar7._M_current)->dbox).smallend.vect + 2) = uVar11;
                          ppCVar1 = (pointer *)
                                    ((long)&(this_02->
                                            super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                                            )._M_impl + 8);
                          *ppCVar1 = *ppCVar1 + 1;
                          local_228.m_bat.m_op.m_bndryReg.m_doilo.vect[2] = iVar30;
                          local_228.m_bat.m_op.m_bndryReg.m_doihi.vect[0] = iVar29;
                        }
                      }
                      if (1 < (int)uVar20) {
                        if (local_1a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_finish ==
                            local_1a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          std::vector<amrex::Box,std::allocator<amrex::Box>>::
                          _M_realloc_insert<amrex::Box_const&>
                                    ((vector<amrex::Box,std::allocator<amrex::Box>> *)&local_1a8,
                                     (iterator)
                                     local_1a8.m_lbox.
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data._M_finish,&local_170);
                        }
                        else {
                          uVar17 = local_170.bigend.vect[1];
                          uVar16 = local_170.bigend.vect[0];
                          auVar58._4_4_ = uVar17;
                          auVar58._0_4_ = uVar16;
                          uVar18 = local_170.bigend.vect[2];
                          auVar58._8_4_ = uVar18;
                          (local_1a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_finish)->bigend = (IntVect)auVar58;
                          (local_1a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_finish)->btype =
                               (IndexType)local_170.btype.itype;
                          *(undefined8 *)
                           ((local_1a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data._M_finish)->smallend).vect =
                               local_170.smallend.vect._0_8_;
                          *(ulong *)(((local_1a8.m_lbox.
                                       super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                       _M_impl.super__Vector_impl_data._M_finish)->smallend).vect +
                                    2) = CONCAT44(local_170.bigend.vect[0],
                                                  local_170.smallend.vect[2]);
                          local_1a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish =
                               local_1a8.m_lbox.
                               super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data._M_finish + 1;
                        }
                      }
                      if (local_50.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_50.m_lbox.
                                        super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                        _M_impl.super__Vector_impl_data._M_start,
                                        (long)local_50.m_lbox.
                                              super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_50.m_lbox.
                                              super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                    }
                    else if (local_230 ==
                             *(int *)(*(long *)&(((fa->distributionMap).m_ref.
                                                  super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr)->m_pmap).
                                                super_vector<int,_std::allocator<int>_>.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl + local_148 * 4)) {
                      pmVar24 = std::
                                map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                                ::operator[]((map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                                              *)local_88._0_8_,&local_22c);
                      local_228.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] =
                           local_170.bigend.vect[1];
                      local_228.m_bat.m_op.m_bndryReg.m_loshft.vect[0] = local_170.bigend.vect[1];
                      local_228.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2] =
                           local_170.bigend.vect[2];
                      local_228.m_bat.m_bat_type = local_170.smallend.vect[0];
                      local_228.m_bat.m_op.m_indexType.m_typ.itype = local_170.smallend.vect[1];
                      local_228.m_bat.m_op.m_bndryReg.m_typ.itype =
                           (IndexType)(IndexType)local_170.smallend.vect[2];
                      local_228.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] =
                           local_170.bigend.vect[0];
                      local_228.m_bat.m_op.m_bndryReg.m_loshft.vect[1] = local_b8._0_4_;
                      local_228.m_bat.m_op.m_bndryReg.m_loshft.vect[2] = local_b8._4_4_;
                      local_228.m_bat.m_op.m_bndryReg.m_hishft.vect[1] = local_c8._0_4_;
                      iVar7._M_current =
                           (pmVar24->
                           super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                      local_228.m_bat.m_op.m_bndryReg.m_hishft.vect[0] = iVar27;
                      local_228.m_bat.m_op.m_bndryReg.m_hishft.vect[2] = iVar50;
                      local_228.m_bat.m_op.m_bndryReg.m_doilo.vect[0] = iVar38;
                      local_228.m_bat.m_op.m_bndryReg.m_doilo.vect[1] = uVar23;
                      if (iVar7._M_current ==
                          (pmVar24->
                          super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        local_228.m_bat.m_op.m_bndryReg.m_doilo.vect[2] = iVar30;
                        local_228.m_bat.m_op.m_bndryReg.m_doihi.vect[0] = iVar29;
                        std::
                        vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                        ::_M_realloc_insert<amrex::FabArrayBase::CopyComTag>
                                  (pmVar24,iVar7,(CopyComTag *)&local_228);
                      }
                      else {
                        auVar15._4_4_ = local_170.bigend.vect[2];
                        auVar15._0_4_ = local_170.bigend.vect[1];
                        auVar15._8_4_ = local_170.bigend.vect[1];
                        auVar15._12_4_ = local_b8._0_4_;
                        *(ulong *)(((iVar7._M_current)->sbox).bigend.vect + 2) =
                             CONCAT44(uVar23,iVar38);
                        (iVar7._M_current)->dstIndex = iVar30;
                        (iVar7._M_current)->srcIndex = iVar29;
                        *(ulong *)(((iVar7._M_current)->sbox).smallend.vect + 1) =
                             CONCAT44(iVar27,local_b8._4_4_);
                        *(ulong *)((iVar7._M_current)->sbox).bigend.vect =
                             CONCAT44(iVar50,local_c8._0_4_);
                        *(undefined1 (*) [16])(((iVar7._M_current)->dbox).bigend.vect + 1) = auVar15
                        ;
                        *(undefined8 *)((iVar7._M_current)->dbox).smallend.vect =
                             local_170.smallend.vect._0_8_;
                        *(ulong *)(((iVar7._M_current)->dbox).smallend.vect + 2) =
                             CONCAT44(local_170.bigend.vect[0],local_170.smallend.vect[2]);
                        ppCVar1 = &(pmVar24->
                                   super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                                   )._M_impl.super__Vector_impl_data._M_finish;
                        *ppCVar1 = *ppCVar1 + 1;
                        local_228.m_bat.m_op.m_bndryReg.m_doilo.vect[2] = iVar30;
                        local_228.m_bat.m_op.m_bndryReg.m_doihi.vect[0] = iVar29;
                      }
                    }
                  }
                }
                if (local_70.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_70.m_lbox.
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_70.m_lbox.
                                        super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_70.m_lbox.
                                        super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                uVar32 = local_150 + 1;
                pFVar33 = local_140;
              } while (uVar32 != local_248);
            }
          }
          uVar32 = local_118;
        }
        if ((long)local_1a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_start < 0x38) {
          (pFVar33->super_CommMetaData).m_threadsafe_loc = true;
          uVar32 = local_118;
        }
        else {
          BoxArray::BoxArray(&local_228,&local_1a8);
          bVar37 = BoxArray::isDisjoint(&local_228);
          uVar32 = local_118;
          (pFVar33->super_CommMetaData).m_threadsafe_loc = bVar37;
          BoxArray::~BoxArray(&local_228);
        }
        if ((long)local_a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            CONCAT44(local_a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_,
                     (int)local_a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start) < 0x38) {
          (pFVar33->super_CommMetaData).m_threadsafe_rcv = true;
        }
        else {
          BoxArray::BoxArray(&local_228,&local_a8);
          bVar37 = BoxArray::isDisjoint(&local_228);
          (pFVar33->super_CommMetaData).m_threadsafe_rcv = bVar37;
          BoxArray::~BoxArray(&local_228);
        }
      }
      uVar32 = uVar32 + 1;
    } while (uVar32 != (local_290 & 0x7fffffff));
  }
  iVar30 = 0;
  do {
    lVar28 = *(long *)((pFVar33->m_crse_ratio).vect + (ulong)(iVar30 != 0) * 2 + -5);
    for (p_Var25 = *(_Rb_tree_node_base **)(lVar28 + 0x18);
        p_Var25 != (_Rb_tree_node_base *)(lVar28 + 8);
        p_Var25 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var25)) {
      p_Var8 = p_Var25[1]._M_parent;
      p_Var9 = p_Var25[1]._M_left;
      if (p_Var8 != p_Var9) {
        uVar32 = (long)p_Var9 - (long)p_Var8 >> 6;
        lVar10 = 0x3f;
        if (uVar32 != 0) {
          for (; uVar32 >> lVar10 == 0; lVar10 = lVar10 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<amrex::FabArrayBase::CopyComTag*,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (p_Var8,p_Var9,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<amrex::FabArrayBase::CopyComTag*,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (p_Var8,p_Var9);
      }
    }
    bVar37 = iVar30 == 0;
    iVar30 = iVar30 + 1;
  } while (bVar37);
  pvVar19 = (void *)CONCAT44(local_a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             (int)local_a8.m_lbox.
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
  if (pvVar19 != (void *)0x0) {
    operator_delete(pvVar19,(long)local_a8.m_lbox.
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar19)
    ;
  }
  if (local_1a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start != (Box *)0x0) {
    operator_delete(local_1a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_130.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_130.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_188.
      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.
                    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_188.
                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.
                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
FabArrayBase::FB::define_epo (const FabArrayBase& fa)
{
    const int                  MyProc   = ParallelDescriptor::MyProc();
    const BoxArray&            ba       = fa.boxArray();
    const DistributionMapping& dm       = fa.DistributionMap();
    const Vector<int>&         imap     = fa.IndexArray();

    // For local copy, all workers in the same team will have the identical copy of tags
    // so that they can share work.  But for remote communication, they are all different.

    const int nlocal = imap.size();
    const IntVect& ng = m_ngrow;
    const IndexType& typ = ba.ixType();
    std::vector< std::pair<int,Box> > isects;

    const std::vector<IntVect>& pshifts = m_period.shiftIntVect();

    auto& send_tags = *m_SndTags;

    Box pdomain = m_period.Domain();
    pdomain.convert(typ);

    for (int i = 0; i < nlocal; ++i)
    {
        const int ksnd = imap[i];
        Box bxsnd = amrex::grow(ba[ksnd],ng);
        bxsnd &= pdomain; // source must be inside the periodic domain.

        if (!bxsnd.ok()) continue;

        for (auto pit=pshifts.cbegin(); pit!=pshifts.cend(); ++pit)
        {
            if (*pit != IntVect::TheZeroVector())
            {
                ba.intersections(bxsnd+(*pit), isects, false, ng);

                for (int j = 0, M = isects.size(); j < M; ++j)
                {
                    const int krcv      = isects[j].first;
                    const Box& bx       = isects[j].second;
                    const int dst_owner = dm[krcv];

                    if (ParallelDescriptor::sameTeam(dst_owner)) {
                        continue;  // local copy will be dealt with later
                    } else if (MyProc == dm[ksnd]) {
                        const BoxList& bl = amrex::boxDiff(bx, pdomain);
                        for (BoxList::const_iterator lit = bl.begin(); lit != bl.end(); ++lit) {
                            send_tags[dst_owner].push_back(CopyComTag(*lit, (*lit)-(*pit), krcv, ksnd));
                        }
                    }
                }
            }
        }
    }

    auto& recv_tags = *m_RcvTags;

    BoxList bl_local(ba.ixType());
    BoxList bl_remote(ba.ixType());

    bool check_local = false, check_remote = false;
#if defined(AMREX_USE_GPU)
    check_local = true;
    check_remote = true;
#elif defined(AMREX_USE_OMP)
    if (omp_get_max_threads() > 1) {
        check_local = true;
        check_remote = true;
    }
#endif

    if (ParallelDescriptor::TeamSize() > 1) {
        check_local = true;
    }

    for (int i = 0; i < nlocal; ++i)
    {
        const int   krcv = imap[i];
        const Box& vbx   = ba[krcv];
        const Box& bxrcv = amrex::grow(vbx, ng);

        if (pdomain.contains(bxrcv)) continue;

        for (std::vector<IntVect>::const_iterator pit=pshifts.begin(); pit!=pshifts.end(); ++pit)
        {
            if (*pit != IntVect::TheZeroVector())
            {
                ba.intersections(bxrcv+(*pit), isects, false, ng);

                for (int j = 0, M = isects.size(); j < M; ++j)
                {
                    const int ksnd      = isects[j].first;
                    const Box& dst_bx   = isects[j].second - *pit;
                    const int src_owner = dm[ksnd];

                    const BoxList& bl = amrex::boxDiff(dst_bx, pdomain);

                    for (BoxList::const_iterator lit = bl.begin(); lit != bl.end(); ++lit)
                    {
                        Box sbx = (*lit) + (*pit);
                        sbx &= pdomain; // source must be inside the periodic domain.

                        if (sbx.ok()) {
                            Box dbx = sbx - (*pit);
                            if (ParallelDescriptor::sameTeam(src_owner)) { // local copy
                                const BoxList tilelist(dbx, FabArrayBase::comm_tile_size);
                                for (BoxList::const_iterator
                                         it_tile  = tilelist.begin(),
                                         End_tile = tilelist.end();   it_tile != End_tile; ++it_tile)
                                {
                                    m_LocTags->push_back(CopyComTag(*it_tile, (*it_tile)+(*pit), krcv, ksnd));
                                }
                                if (check_local) {
                                    bl_local.push_back(dbx);
                                }
                            } else if (MyProc == dm[krcv]) {
                                recv_tags[src_owner].push_back(CopyComTag(dbx, sbx, krcv, ksnd));
                                if (check_remote) {
                                    bl_remote.push_back(dbx);
                                }
                            }
                        }
                    }
                }
            }
        }

        if (bl_local.size() <= 1) {
            m_threadsafe_loc = true;
        } else {
            m_threadsafe_loc = BoxArray(std::move(bl_local)).isDisjoint();
        }

        if (bl_remote.size() <= 1) {
            m_threadsafe_rcv = true;
        } else {
            m_threadsafe_rcv = BoxArray(std::move(bl_remote)).isDisjoint();
        }
    }

    for (int ipass = 0; ipass < 2; ++ipass) // pass 0: send; pass 1: recv
    {
        CopyComTag::MapOfCopyComTagContainers & Tags = (ipass == 0) ? *m_SndTags : *m_RcvTags;
        for (auto& kv : Tags)
        {
            std::vector<CopyComTag>& cctv = kv.second;
            // We need to fix the order so that the send and recv processes match.
            std::sort(cctv.begin(), cctv.end());
        }
    }
}